

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.c
# Opt level: O3

void Curl_hash_destroy(Curl_hash *h)

{
  Curl_llist *pCVar1;
  long lVar2;
  ulong uVar3;
  
  pCVar1 = h->table;
  if (pCVar1 != (Curl_llist *)0x0) {
    if (h->slots != 0) {
      lVar2 = 0;
      uVar3 = 0;
      do {
        Curl_llist_destroy((Curl_llist *)((long)&h->table->_head + lVar2),h);
        uVar3 = uVar3 + 1;
        lVar2 = lVar2 + 0x20;
      } while (uVar3 < h->slots);
      pCVar1 = h->table;
    }
    (*Curl_cfree)(pCVar1);
    h->table = (Curl_llist *)0x0;
  }
  h->slots = 0;
  h->size = 0;
  return;
}

Assistant:

void
Curl_hash_destroy(struct Curl_hash *h)
{
  DEBUGASSERT(h->init == HASHINIT);
  if(h->table) {
    size_t i;
    for(i = 0; i < h->slots; ++i) {
      Curl_llist_destroy(&h->table[i], (void *) h);
    }
    Curl_safefree(h->table);
  }
  h->size = 0;
  h->slots = 0;
}